

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O1

QHttpNetworkRequest __thiscall
QHttpNetworkConnectionPrivate::predictNextRequest(QHttpNetworkConnectionPrivate *this)

{
  long lVar1;
  long lVar2;
  totally_ordered_wrapper<QHttpNetworkRequestPrivate_*> extraout_RDX;
  QSharedDataPointer<QHttpNetworkRequestPrivate> QVar3;
  totally_ordered_wrapper<QHttpNetworkRequestPrivate_*> extraout_RDX_00;
  long in_RSI;
  long in_FS_OFFSET;
  QHttpNetworkRequest QVar4;
  QUrl local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(in_RSI + 0xd8);
  if (lVar1 == 0) {
    lVar1 = *(long *)(in_RSI + 0xf0);
    if (lVar1 == 0) {
      QUrl::QUrl(&local_20);
      QHttpNetworkRequest::QHttpNetworkRequest
                ((QHttpNetworkRequest *)this,&local_20,Get,NormalPriority);
      QUrl::~QUrl(&local_20);
      QVar3.d.ptr = (totally_ordered_wrapper<QHttpNetworkRequestPrivate_*>)
                    (totally_ordered_wrapper<QHttpNetworkRequestPrivate_*>)extraout_RDX_00.ptr;
      if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_00204341;
      goto LAB_002042fc;
    }
    lVar2 = *(long *)(in_RSI + 0xe8);
  }
  else {
    lVar2 = *(long *)(in_RSI + 0xd0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
LAB_00204341:
    __stack_chk_fail();
  }
  QHttpNetworkRequest::QHttpNetworkRequest
            ((QHttpNetworkRequest *)this,(QHttpNetworkRequest *)(lVar2 + lVar1 * 0x18 + -0x18));
  QVar3.d.ptr = (totally_ordered_wrapper<QHttpNetworkRequestPrivate_*>)
                (totally_ordered_wrapper<QHttpNetworkRequestPrivate_*>)extraout_RDX.ptr;
LAB_002042fc:
  QVar4.d.d.ptr = QVar3.d.ptr;
  QVar4.super_QHttpNetworkHeader._vptr_QHttpNetworkHeader = (_func_int **)this;
  return QVar4;
}

Assistant:

QHttpNetworkRequest QHttpNetworkConnectionPrivate::predictNextRequest() const
{
    if (!highPriorityQueue.isEmpty())
        return highPriorityQueue.last().first;
    if (!lowPriorityQueue.isEmpty())
        return lowPriorityQueue.last().first;
    return QHttpNetworkRequest();
}